

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O3

void __thiscall
leveldb::InternalKeyComparator::FindShortestSeparator
          (InternalKeyComparator *this,string *start,Slice *limit)

{
  ulong uVar1;
  int iVar2;
  string tmp;
  Slice user_start;
  Slice user_limit;
  string local_80;
  pointer local_60;
  ulong local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  ulong local_48;
  char *local_40;
  long local_38;
  
  local_60 = (start->_M_dataplus)._M_p;
  uVar1 = start->_M_string_length - 8;
  local_40 = limit->data_;
  local_38 = limit->size_ - 8;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_58 = uVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,local_60,local_60 + (start->_M_string_length - 8));
  (*this->user_comparator_->_vptr_Comparator[4])(this->user_comparator_,&local_80,&local_40);
  if (local_80._M_string_length < uVar1) {
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_80._M_dataplus._M_p;
    local_48 = local_80._M_string_length;
    iVar2 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&local_60);
    if (iVar2 < 0) {
      PutFixed64(&local_80,0xffffffffffffff01);
      std::__cxx11::string::swap((string *)start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void InternalKeyComparator::FindShortestSeparator(std::string* start,
                                                  const Slice& limit) const {
  // Attempt to shorten the user portion of the key
  Slice user_start = ExtractUserKey(*start);
  Slice user_limit = ExtractUserKey(limit);
  std::string tmp(user_start.data(), user_start.size());
  user_comparator_->FindShortestSeparator(&tmp, user_limit);
  if (tmp.size() < user_start.size() &&
      user_comparator_->Compare(user_start, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*start, tmp) < 0);
    assert(this->Compare(tmp, limit) < 0);
    start->swap(tmp);
  }
}